

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O1

int genmmd_(int *neqns,int_t *xadj,shortint *adjncy,int *invp,int *perm,int_t *delta,shortint *dhead
           ,shortint *qsize,shortint *llist,shortint *marker,int_t *maxint,int_t *nofsub)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  uint local_88;
  int_t tag;
  uint local_80;
  uint local_7c;
  int *local_78;
  int *local_70;
  int *local_68;
  uint local_5c;
  int local_58;
  int local_54;
  int_t *local_50;
  uint *local_48;
  shortint *local_40;
  shortint *local_38;
  
  if (0 < *neqns) {
    *nofsub = 0;
    local_78 = perm;
    local_70 = invp;
    local_68 = delta;
    local_40 = adjncy;
    slu_mmdint_(neqns,xadj,adjncy,dhead,invp,perm,qsize,llist,marker);
    if (*dhead < 1) {
      iVar16 = 1;
    }
    else {
      iVar16 = -1;
      uVar1 = *dhead;
      do {
        local_80 = uVar1;
        uVar1 = local_70[(ulong)local_80 - 1];
        marker[(ulong)local_80 - 1] = *maxint;
        local_70[(ulong)local_80 - 1] = iVar16;
        iVar16 = iVar16 + -1;
      } while (0 < (int)uVar1);
      iVar16 = -iVar16;
    }
    if (iVar16 <= *neqns) {
      tag = 1;
      *dhead = 0;
      local_88 = 2;
      local_38 = dhead + -1;
      local_50 = xadj;
      local_48 = (uint *)neqns;
      do {
        uVar13 = (ulong)(local_88 - 1);
        piVar4 = local_38 + (int)local_88;
        do {
          local_88 = (int)uVar13 + 1;
          uVar13 = (ulong)local_88;
          iVar10 = *piVar4;
          piVar4 = piVar4 + 1;
        } while (iVar10 < 1);
        iVar9 = *local_68 + local_88;
        local_7c = 0;
        lVar7 = 0;
        iVar10 = iVar9;
        iVar11 = tag;
        do {
          iVar12 = (int)uVar13;
          lVar5 = (long)iVar12;
          lVar15 = 0;
          while( true ) {
            uVar1 = local_38[lVar5 + lVar15];
            lVar8 = (long)(int)uVar1;
            uVar17 = (uint)lVar7;
            local_80 = uVar1;
            if (0 < lVar8) break;
            lVar8 = lVar5 + lVar15;
            lVar15 = lVar15 + 1;
            if (iVar9 <= lVar8) {
              if (iVar10 < iVar12) {
                iVar10 = iVar12;
              }
              local_88 = iVar10 + 1;
              local_7c = uVar17;
              goto LAB_0010e08b;
            }
          }
          iVar2 = local_70[lVar8 + -1];
          local_38[lVar5 + lVar15] = iVar2;
          iVar14 = (int)lVar15;
          if (0 < (long)iVar2) {
            local_78[(long)iVar2 + -1] = -(iVar12 + iVar14);
          }
          local_70[lVar8 + -1] = -iVar16;
          *nofsub = qsize[lVar8 + -1] + *nofsub + iVar12 + iVar14 + -2;
          uVar3 = *local_48;
          if ((int)uVar3 < qsize[lVar8 + -1] + iVar16) {
            local_88 = iVar12 + iVar14;
            neqns = (int *)local_48;
            local_7c = uVar17;
            goto LAB_0010e0f5;
          }
          tag = iVar11 + 1;
          if (*maxint <= tag) {
            tag = 1;
            if (0 < (int)uVar3) {
              uVar6 = 0;
              do {
                if (marker[uVar6] < *maxint) {
                  marker[uVar6] = 0;
                }
                uVar6 = uVar6 + 1;
              } while (uVar3 != uVar6);
            }
          }
          uVar13 = (uVar13 & 0xffffffff) + lVar15;
          local_5c = uVar17;
          local_58 = tag;
          local_54 = iVar10;
          slu_mmdelm_((int_t *)&local_80,local_50,local_40,dhead,local_70,local_78,qsize,llist,
                      marker,maxint,&tag);
          iVar16 = iVar16 + qsize[lVar8 + -1];
          llist[lVar8 + -1] = local_5c;
          lVar7 = lVar8;
          iVar10 = local_54;
          iVar11 = local_58;
        } while (-1 < *local_68);
        local_88 = iVar12 + iVar14;
        local_7c = uVar1;
LAB_0010e08b:
        neqns = (int *)local_48;
        if ((int)*local_48 < iVar16) break;
        slu_mmdupd_((int_t *)&local_7c,(int *)local_48,local_50,local_40,local_68,(int_t *)&local_88
                    ,dhead,local_70,local_78,qsize,llist,marker,maxint,&tag);
      } while( true );
    }
LAB_0010e0f5:
    slu_mmdnum_(neqns,local_78,local_70,qsize);
  }
  return 0;
}

Assistant:

int genmmd_(int *neqns, int_t *xadj, shortint *adjncy, 
	int *invp, int *perm, int_t *delta, shortint *dhead, 
	shortint *qsize, shortint *llist, shortint *marker, int_t *maxint, 
	int_t *nofsub)
{
    /* System generated locals */
    int i__1;

    /* Local variables */
    int_t mdeg, ehead, i, mdlmt, mdnode;
    extern /* Subroutine */
    int slu_mmdelm_(const int_t *mdnode, int_t *xadj, shortint *adjncy,
                    shortint *dhead, int *dforw, int *dbakw, shortint *qsize,
                    shortint *llist, shortint *marker, const int_t *maxint, const int_t *tag),
    slu_mmdupd_(const int_t *ehead, const int *neqns, int_t *xadj,
                shortint *adjncy, const int_t *delta, int_t *mdeg, shortint *dhead,
                int *dforw, int *dbakw, shortint *qsize, shortint *llist,
                shortint *marker, const int_t *maxint, int_t *tag),
    slu_mmdint_(const int *neqns, int_t *xadj, shortint *adjncy,
                shortint *dhead, int *dforw, int *dbakw, shortint *qsize,
                shortint *llist, shortint *marker),
    slu_mmdnum_(const int *neqns, int *perm, int *invp, shortint *qsize);

    int_t nextmd, tag, num;

/* *************************************************************** */


/* *************************************************************** */

    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dhead;
    --perm;
    --invp;
    --adjncy;
    --xadj;

    /* Function Body */
    if (*neqns <= 0) {
	return 0;
    }

/*        ------------------------------------------------ */
/*        INITIALIZATION FOR THE MINIMUM DEGREE ALGORITHM. */
/*        ------------------------------------------------ */
    *nofsub = 0;
    slu_mmdint_(neqns, &xadj[1], &adjncy[1], &dhead[1], &invp[1], &perm[1], &
	    qsize[1], &llist[1], &marker[1]);

/*        ---------------------------------------------- */
/*        NUM COUNTS THE NUMBER OF ORDERED NODES PLUS 1. */
/*        ---------------------------------------------- */
    num = 1;

/*        ----------------------------- */
/*        ELIMINATE ALL ISOLATED NODES. */
/*        ----------------------------- */
    nextmd = dhead[1];
L100:
    if (nextmd <= 0) {
	goto L200;
    }
    mdnode = nextmd;
    nextmd = invp[mdnode];
    marker[mdnode] = *maxint;
    invp[mdnode] = -num;
    ++num;
    goto L100;

L200:
/*        ---------------------------------------- */
/*        SEARCH FOR NODE OF THE MINIMUM DEGREE. */
/*        MDEG IS THE CURRENT MINIMUM DEGREE; */
/*        TAG IS USED TO FACILITATE MARKING NODES. */
/*        ---------------------------------------- */
    if (num > *neqns) {
	goto L1000;
    }
    tag = 1;
    dhead[1] = 0;
    mdeg = 2;
L300:
    if (dhead[mdeg] > 0) {
	goto L400;
    }
    ++mdeg;
    goto L300;
L400:
/*            ------------------------------------------------- */
/*            USE VALUE OF DELTA TO SET UP MDLMT, WHICH GOVERNS */
/*            WHEN A DEGREE UPDATE IS TO BE PERFORMED. */
/*            ------------------------------------------------- */
    mdlmt = mdeg + *delta;
    ehead = 0;

L500:
    mdnode = dhead[mdeg];
    if (mdnode > 0) {
	goto L600;
    }
    ++mdeg;
    if (mdeg > mdlmt) {
	goto L900;
    }
    goto L500;
L600:
/*                ---------------------------------------- */
/*                REMOVE MDNODE FROM THE DEGREE STRUCTURE. */
/*                ---------------------------------------- */
    nextmd = invp[mdnode];
    dhead[mdeg] = nextmd;
    if (nextmd > 0) {
	perm[nextmd] = -mdeg;
    }
    invp[mdnode] = -num;
    *nofsub = *nofsub + mdeg + qsize[mdnode] - 2;
    if (num + qsize[mdnode] > *neqns) {
	goto L1000;
    }
/*                ---------------------------------------------- */
/*                ELIMINATE MDNODE AND PERFORM QUOTIENT GRAPH */
/*                TRANSFORMATION.  RESET TAG VALUE IF NECESSARY. */
/*                ---------------------------------------------- */
    ++tag;
    if (tag < *maxint) {
	goto L800;
    }
    tag = 1;
    i__1 = *neqns;
    for (i = 1; i <= i__1; ++i) {
	if (marker[i] < *maxint) {
	    marker[i] = 0;
	}
/* L700: */
    }
L800:
    slu_mmdelm_(&mdnode, &xadj[1], &adjncy[1], &dhead[1], &invp[1], &perm[1], &
	    qsize[1], &llist[1], &marker[1], maxint, &tag);
    num += qsize[mdnode];
    llist[mdnode] = ehead;
    ehead = mdnode;
    if (*delta >= 0) {
	goto L500;
    }
L900:
/*            ------------------------------------------- */
/*            UPDATE DEGREES OF THE NODES INVOLVED IN THE */
/*            MINIMUM DEGREE NODES ELIMINATION. */
/*            ------------------------------------------- */
    if (num > *neqns) {
	goto L1000;
    }
    slu_mmdupd_(&ehead, neqns, &xadj[1], &adjncy[1], delta, &mdeg, &dhead[1], &
	    invp[1], &perm[1], &qsize[1], &llist[1], &marker[1], maxint, &tag)
	    ;
    goto L300;

L1000:
    slu_mmdnum_(neqns, &perm[1], &invp[1], &qsize[1]);
    return 0;

}